

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re_std.cc
# Opt level: O3

bool __thiscall benchmark::Regex::Init(Regex *this,string *spec,string *error)

{
  basic_regex<char,_std::__cxx11::regex_traits<char>_> bStack_38;
  
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&bStack_38,spec,0x40);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::operator=
            (&this->re_,&bStack_38);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&bStack_38);
  this->init_ = true;
  return true;
}

Assistant:

bool Regex::Init(const std::string& spec, std::string* error) {
  try {
    re_ = std::regex(spec, std::regex_constants::extended);

    init_ = true;
  } catch (const std::regex_error& e) {
    if (error) {
      *error = e.what();
    }
  }
  return init_;
}